

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

bool __thiscall
cmComputeLinkInformation::AddLibraryFeature(cmComputeLinkInformation *this,string *feature)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmGlobalGenerator *pcVar4;
  cmLocalGenerator *pcVar5;
  cmake *pcVar6;
  pointer pBVar7;
  bool bVar8;
  iterator iVar9;
  cmValue cVar10;
  long lVar11;
  string *psVar12;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pcVar13;
  _Alloc_hider _Var14;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  undefined1 local_280 [48];
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  items;
  undefined1 local_228 [16];
  undefined1 local_218 [32];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  _Base_ptr local_1d8;
  undefined1 local_1d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  undefined1 local_180 [16];
  string featureName;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  undefined1 local_130 [32];
  undefined1 local_110 [32];
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = &this->LibraryFeatureDescriptors;
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
          ::find(&this_00->_M_t,feature);
  if ((_Rb_tree_header *)iVar9._M_node !=
      &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
    return (bool)(char)iVar9._M_node[3]._M_color;
  }
  local_218._8_8_ = (this->LinkLanguage)._M_dataplus._M_p;
  local_218._0_8_ = (this->LinkLanguage)._M_string_length;
  local_228._0_8_ = (element_type *)0x6;
  local_228._8_8_ = "CMAKE_";
  local_218._16_8_ = &DAT_00000014;
  local_218._24_8_ = (long)"CMAKE_LINK_LIBRARY_USING_" + 5;
  local_1f8._8_8_ = (feature->_M_dataplus)._M_p;
  local_1f8._0_8_ = feature->_M_string_length;
  views._M_len = 4;
  views._M_array = (iterator)local_228;
  cmCatViews_abi_cxx11_(&featureName,views);
  pcVar2 = this->Makefile;
  local_228._0_8_ = featureName._M_string_length;
  local_228._8_8_ = featureName._M_dataplus._M_p;
  local_218._0_8_ = (cmLocalGenerator *)0xa;
  local_218._8_8_ = (long)"CMAKE_CUDA_PIE_SUPPORTED" + 0xe;
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_228;
  cmCatViews_abi_cxx11_((string *)local_280,views_00);
  cVar10 = cmMakefile::GetDefinition(pcVar2,(string *)local_280);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_280 + 0x10);
  pcVar13 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._0_8_ != paVar1) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
    pcVar13 = extraout_RDX_00;
  }
  if (cVar10.Value == (string *)0x0) {
    local_218._8_8_ = (feature->_M_dataplus)._M_p;
    local_218._0_8_ = feature->_M_string_length;
    local_228._0_8_ = (element_type *)0x19;
    local_228._8_8_ = "CMAKE_LINK_LIBRARY_USING_";
    views_01._M_len = 2;
    views_01._M_array = (iterator)local_228;
    cmCatViews_abi_cxx11_((string *)local_280,views_01);
    std::__cxx11::string::operator=((string *)&featureName,(string *)local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ != paVar1) {
      operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
    }
    pcVar2 = this->Makefile;
    local_228._0_8_ = featureName._M_string_length;
    local_228._8_8_ = featureName._M_dataplus._M_p;
    local_218._0_8_ = (cmLocalGenerator *)0xa;
    local_218._8_8_ = (long)"CMAKE_CUDA_PIE_SUPPORTED" + 0xe;
    views_02._M_len = 2;
    views_02._M_array = (iterator)local_228;
    cmCatViews_abi_cxx11_((string *)local_280,views_02);
    cVar10 = cmMakefile::GetDefinition(pcVar2,(string *)local_280);
    pcVar13 = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ != paVar1) {
      operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
      pcVar13 = extraout_RDX_02;
    }
    if (cVar10.Value != (string *)0x0) goto LAB_004362ac;
LAB_0043648b:
    memset((element_type *)local_218,0,0x98);
    local_228._8_8_ = (cmMakefile *)0x0;
    local_218._16_8_ = local_218._16_8_ & 0xffffffffffffff00;
    local_218._24_8_ = local_1f8 + 8;
    local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
    local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
    local_1b0._M_local_buf[0] = false;
    local_190._M_local_buf[0] = '\0';
    local_228._0_8_ = (element_type *)local_218;
    local_1e8._8_8_ = local_1d0;
    local_1d0._16_8_ = &local_1b0;
    local_1a0._M_allocated_capacity = (size_type)&local_190;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                *)this_00,feature,(FeatureDescriptor *)local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_allocated_capacity != &local_190) {
      operator_delete((void *)local_1a0._M_allocated_capacity,
                      CONCAT71(local_190._M_allocated_capacity._1_7_,local_190._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._16_8_ != &local_1b0) {
      operator_delete((void *)local_1d0._16_8_,
                      CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_1e8._8_8_ != local_1d0) {
      operator_delete((void *)local_1e8._8_8_,(ulong)(local_1d0._0_8_ + 1));
    }
    if ((undefined1 *)local_218._24_8_ != local_1f8 + 8) {
      operator_delete((void *)local_218._24_8_,local_1f8._8_8_ + 1);
    }
    if ((element_type *)local_228._0_8_ != (element_type *)local_218) {
      operator_delete((void *)local_228._0_8_,(ulong)(local_218._0_8_ + 1));
    }
    pcVar6 = this->CMakeInstance;
    pcVar4 = (cmGlobalGenerator *)(feature->_M_dataplus)._M_p;
    pcVar5 = (cmLocalGenerator *)feature->_M_string_length;
    psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    local_228._0_8_ = (element_type *)0x9;
    local_228._8_8_ = "Feature \'";
    local_218._16_8_ = (pointer)0x4c;
    local_218._24_8_ =
         "\', specified through generator-expression \'$<LINK_LIBRARY>\' to link target \'";
    local_1f8._8_8_ = (psVar12->_M_dataplus)._M_p;
    local_1f8._0_8_ = psVar12->_M_string_length;
    local_1e8._0_8_ = 0x1d;
    local_1e8._8_8_ = "\', is not supported for the \'";
    local_1d0._0_8_ = (this->LinkLanguage)._M_dataplus._M_p;
    local_1d8 = (_Base_ptr)(this->LinkLanguage)._M_string_length;
    local_1d0._8_8_ = (_Base_ptr)0x10;
    local_1d0._16_8_ = "\' link language.";
    views_03._M_len = 7;
    views_03._M_array = (iterator)local_228;
    local_218._0_8_ = pcVar5;
    local_218._8_8_ = pcVar4;
    cmCatViews_abi_cxx11_((string *)local_280,views_03);
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_228);
    cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)local_280,(cmListFileBacktrace *)local_228);
  }
  else {
LAB_004362ac:
    value._M_str = pcVar13;
    value._M_len = (size_t)((cVar10.Value)->_M_dataplus)._M_p;
    bVar8 = cmValue::IsOn((cmValue *)(cVar10.Value)->_M_string_length,value);
    if (!bVar8) goto LAB_0043648b;
    cVar10 = cmMakefile::GetDefinition(this->Makefile,&featureName);
    if (cVar10.Value != (string *)0x0) {
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_228);
      cmExpandListWithBacktrace(&items,cVar10.Value,(cmListFileBacktrace *)local_228,true);
      if ((cmMakefile *)local_228._8_8_ != (cmMakefile *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
      }
      if (((long)items.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)items.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start != 0x30) ||
         (bVar8 = anon_unknown.dwarf_19ef618::IsValidFeatureFormat
                            (&(items.
                               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->Value), bVar8)) {
        lVar11 = (long)items.
                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)items.
                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (lVar11 == 0x90) {
          bVar8 = anon_unknown.dwarf_19ef618::IsValidFeatureFormat
                            (&items.
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].Value);
          if (!bVar8) goto LAB_00436899;
          lVar11 = (long)items.
                         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)items.
                         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        }
        lVar11 = (lVar11 >> 4) * -0x5555555555555555;
        local_280._0_8_ = paVar1;
        if (lVar11 != 3) {
          if (lVar11 == 1) {
            std::
            vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push_back(&items,items.
                               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
            pBVar7 = items.
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_228._0_8_ = (element_type *)local_218;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"PATH{","");
            std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"NAME{","");
            anon_unknown.dwarf_19ef618::FinalizeFeatureFormat
                      (&pBVar7->Value,(string *)local_228,(string *)local_280._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._0_8_ != paVar1) {
              operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
            }
            if ((element_type *)local_228._0_8_ != (element_type *)local_218) {
              operator_delete((void *)local_228._0_8_,(ulong)(local_218._0_8_ + 1));
            }
            pBVar7 = items.
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_228._0_8_ = (element_type *)local_218;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"NAME{","");
            local_280._0_8_ = paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"PATH{","");
            anon_unknown.dwarf_19ef618::FinalizeFeatureFormat
                      (&pBVar7[1].Value,(string *)local_228,(string *)local_280._0_8_);
            goto LAB_00436b84;
          }
          memset((element_type *)local_218,0,0x98);
          local_228._8_8_ = (cmMakefile *)0x0;
          local_218._16_8_ = local_218._16_8_ & 0xffffffffffffff00;
          local_218._24_8_ = local_1f8 + 8;
          local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
          local_1e8._8_8_ = local_1d0;
          local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
          local_1d0._16_8_ = &local_1b0;
          local_1b0._M_local_buf[0] = false;
          local_1a0._M_allocated_capacity = (size_type)&local_190;
          local_190._M_local_buf[0] = '\0';
          local_228._0_8_ = (element_type *)local_218;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00,feature,(FeatureDescriptor *)local_228);
          FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_228);
          pcVar6 = this->CMakeInstance;
          local_228._0_8_ = (element_type *)0x9;
          local_228._8_8_ = "Feature \'";
          local_280._8_8_ = (feature->_M_dataplus)._M_p;
          local_280._0_8_ = feature->_M_string_length;
          psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          cmStrCat<char[27],std::__cxx11::string,char[79],std::__cxx11::string,char[3]>
                    ((string *)&local_150,(cmAlphaNum *)local_228,(cmAlphaNum *)local_280,
                     (char (*) [27])"\', specified by variable \'",&featureName,
                     (char (*) [79])
                     "\', is malformed (wrong number of elements) and cannot be used to link target \'"
                     ,psVar12,(char (*) [3])0x7651e7);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_180);
          cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)&local_150,
                              (cmListFileBacktrace *)local_180);
joined_r0x00436ec5:
          if ((cmMakefile *)local_180._8_8_ != (cmMakefile *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_allocated_capacity != &local_140) goto LAB_00437237;
          goto LAB_0043723f;
        }
        std::
        vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::insert(&items,items.
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1,
                 (value_type *)
                 (items.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1));
        pBVar7 = items.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_228._0_8_ = (element_type *)local_218;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"PATH{","");
        std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"NAME{","");
        anon_unknown.dwarf_19ef618::FinalizeFeatureFormat
                  (&pBVar7[1].Value,(string *)local_228,(string *)local_280._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._0_8_ != paVar1) {
          operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
        }
        if ((element_type *)local_228._0_8_ != (element_type *)local_218) {
          operator_delete((void *)local_228._0_8_,(ulong)(local_218._0_8_ + 1));
        }
        pBVar7 = items.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_228._0_8_ = (element_type *)local_218;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"NAME{","");
        local_280._0_8_ = paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"PATH{","");
        anon_unknown.dwarf_19ef618::FinalizeFeatureFormat
                  (&pBVar7[2].Value,(string *)local_228,(string *)local_280._0_8_);
LAB_00436b84:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._0_8_ != paVar1) {
          operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
        }
        if ((element_type *)local_228._0_8_ != (element_type *)local_218) {
          operator_delete((void *)local_228._0_8_,(ulong)(local_218._0_8_ + 1));
        }
        if ((((long)items.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)items.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x60) &&
            (bVar8 = anon_unknown.dwarf_19ef618::IsValidFeatureFormat
                               (&(items.
                                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->Value), !bVar8)) ||
           (((long)items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == 0xc0 &&
            (bVar8 = anon_unknown.dwarf_19ef618::IsValidFeatureFormat
                               (&items.
                                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].Value), !bVar8)))) {
          memset((element_type *)local_218,0,0x98);
          local_228._8_8_ = (cmMakefile *)0x0;
          local_218._16_8_ = local_218._16_8_ & 0xffffffffffffff00;
          local_218._24_8_ = local_1f8 + 8;
          local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
          local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
          local_1b0._M_local_buf[0] = false;
          local_190._M_local_buf[0] = '\0';
          local_228._0_8_ = (element_type *)local_218;
          local_1e8._8_8_ = local_1d0;
          local_1d0._16_8_ = &local_1b0;
          local_1a0._M_allocated_capacity = (size_type)&local_190;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00,feature,(FeatureDescriptor *)local_228);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_allocated_capacity != &local_190) {
            operator_delete((void *)local_1a0._M_allocated_capacity,
                            CONCAT71(local_190._M_allocated_capacity._1_7_,local_190._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._16_8_ != &local_1b0) {
            operator_delete((void *)local_1d0._16_8_,
                            CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]
                                    ) + 1);
          }
          if ((undefined1 *)local_1e8._8_8_ != local_1d0) {
            operator_delete((void *)local_1e8._8_8_,(ulong)(local_1d0._0_8_ + 1));
          }
          if ((undefined1 *)local_218._24_8_ != local_1f8 + 8) {
            operator_delete((void *)local_218._24_8_,local_1f8._8_8_ + 1);
          }
          if ((element_type *)local_228._0_8_ != (element_type *)local_218) {
            operator_delete((void *)local_228._0_8_,(ulong)(local_218._0_8_ + 1));
          }
          pcVar6 = this->CMakeInstance;
          pcVar4 = (cmGlobalGenerator *)(feature->_M_dataplus)._M_p;
          pcVar5 = (cmLocalGenerator *)feature->_M_string_length;
          psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          local_228._0_8_ = (element_type *)0x9;
          local_228._8_8_ = "Feature \'";
          local_218._16_8_ = (pointer)0x1a;
          local_218._24_8_ = "\', specified by variable \'";
          local_1f8._0_8_ = featureName._M_string_length;
          local_1f8._8_8_ = featureName._M_dataplus._M_p;
          local_1e8._0_8_ = 0x8f;
          local_1e8._8_8_ =
               "\', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or \"<LINK_ITEM>\" patterns are missing for \"PATH{}\" alternative) and cannot be used to link target \'"
          ;
          local_1d0._0_8_ = (psVar12->_M_dataplus)._M_p;
          local_1d8 = (_Base_ptr)psVar12->_M_string_length;
          local_1d0._8_8_ = (_Base_ptr)0x2;
          local_1d0._16_8_ = (long)"\nmay not start with \'-\'." + 0x16;
          views_06._M_len = 7;
          views_06._M_array = (iterator)local_228;
          local_218._0_8_ = pcVar5;
          local_218._8_8_ = pcVar4;
          cmCatViews_abi_cxx11_((string *)local_280,views_06);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_228);
          cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)local_280,
                              (cmListFileBacktrace *)local_228);
          goto joined_r0x004370bf;
        }
        if ((((long)items.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)items.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x60) &&
            (bVar8 = anon_unknown.dwarf_19ef618::IsValidFeatureFormat
                               (&items.
                                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].Value), !bVar8)) ||
           (((long)items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == 0xc0 &&
            (bVar8 = anon_unknown.dwarf_19ef618::IsValidFeatureFormat
                               (&items.
                                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[2].Value), !bVar8)))) {
          memset((element_type *)local_218,0,0x98);
          local_228._8_8_ = (cmMakefile *)0x0;
          local_218._16_8_ = local_218._16_8_ & 0xffffffffffffff00;
          local_218._24_8_ = local_1f8 + 8;
          local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
          local_1e8._8_8_ = local_1d0;
          local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
          local_1d0._16_8_ = &local_1b0;
          local_1b0._M_local_buf[0] = false;
          local_1a0._M_allocated_capacity = (size_type)&local_190;
          local_190._M_local_buf[0] = '\0';
          local_228._0_8_ = (element_type *)local_218;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00,feature,(FeatureDescriptor *)local_228);
          FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_228);
          pcVar6 = this->CMakeInstance;
          local_228._0_8_ = (element_type *)0x9;
          local_228._8_8_ = "Feature \'";
          local_280._8_8_ = (feature->_M_dataplus)._M_p;
          local_280._0_8_ = feature->_M_string_length;
          psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          cmStrCat<char[27],std::__cxx11::string,char[144],std::__cxx11::string,char[3]>
                    ((string *)&local_150,(cmAlphaNum *)local_228,(cmAlphaNum *)local_280,
                     (char (*) [27])"\', specified by variable \'",&featureName,
                     (char (*) [144])
                     "\', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or \"<LINK_ITEM>\" patterns are missing for \"NAME{}\" alternative) and cannot be used to link target \'"
                     ,psVar12,(char (*) [3])0x7651e7);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_180);
          cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)&local_150,
                              (cmListFileBacktrace *)local_180);
          goto joined_r0x00436ec5;
        }
        cmGeneratorTarget::ResolveLinkerWrapper(this->Target,&items,&this->LinkLanguage,true);
        if ((long)items.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)items.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x60) {
          pcVar3 = (feature->_M_dataplus)._M_p;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar3,pcVar3 + feature->_M_string_length);
          pcVar3 = ((items.
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->Value)._M_dataplus._M_p;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar3,
                     pcVar3 + ((items.
                                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->Value)._M_string_length)
          ;
          pcVar3 = items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].Value._M_dataplus._M_p;
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar3,
                     pcVar3 + items.
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].Value._M_string_length);
          LibraryFeatureDescriptor::LibraryFeatureDescriptor
                    ((LibraryFeatureDescriptor *)local_228,&local_50,&local_70,&local_90);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::LibraryFeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00,feature,(LibraryFeatureDescriptor *)local_228);
          FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_228);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,
                            (ulong)(local_90.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          local_b0.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
          _Var14._M_p = local_50._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_0043742d:
            operator_delete(_Var14._M_p,
                            (ulong)((long)&((_Base_ptr)local_b0.field_2._M_allocated_capacity)->
                                           _M_color + 1));
          }
        }
        else {
          pcVar3 = (feature->_M_dataplus)._M_p;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar3,pcVar3 + feature->_M_string_length);
          pcVar3 = ((items.
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->Value)._M_dataplus._M_p;
          local_d0._0_8_ = (_Base_ptr)(local_d0 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d0,pcVar3,
                     pcVar3 + ((items.
                                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->Value)._M_string_length)
          ;
          local_130._0_8_ = local_130 + 0x10;
          pcVar3 = items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].Value._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_130,pcVar3,
                     pcVar3 + items.
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].Value._M_string_length);
          pcVar3 = items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2].Value._M_dataplus._M_p;
          local_f0._0_8_ = (_Base_ptr)(local_f0 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f0,pcVar3,
                     pcVar3 + items.
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[2].Value._M_string_length);
          pcVar3 = items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3].Value._M_dataplus._M_p;
          local_110._0_8_ = (_Base_ptr)(local_110 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_110,pcVar3,
                     pcVar3 + items.
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[3].Value._M_string_length);
          LibraryFeatureDescriptor::LibraryFeatureDescriptor
                    ((LibraryFeatureDescriptor *)local_228,&local_b0,(string *)local_d0,
                     (string *)local_130,(string *)local_f0,(string *)local_110);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::LibraryFeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00,feature,(LibraryFeatureDescriptor *)local_228);
          FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_228);
          if ((_Base_ptr)local_110._0_8_ != (_Base_ptr)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
          }
          if ((_Base_ptr)local_f0._0_8_ != (_Base_ptr)(local_f0 + 0x10)) {
            operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
          }
          if ((_Base_ptr)local_130._0_8_ != (_Base_ptr)(local_130 + 0x10)) {
            operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
          }
          if ((_Base_ptr)local_d0._0_8_ != (_Base_ptr)(local_d0 + 0x10)) {
            operator_delete((void *)local_d0._0_8_,(ulong)(local_d0._16_8_ + 1));
          }
          _Var14._M_p = local_b0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) goto LAB_0043742d;
        }
        bVar8 = true;
      }
      else {
LAB_00436899:
        memset((element_type *)local_218,0,0x98);
        local_228._8_8_ = (cmMakefile *)0x0;
        local_218._16_8_ = local_218._16_8_ & 0xffffffffffffff00;
        local_218._24_8_ = local_1f8 + 8;
        local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
        local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
        local_1b0._M_local_buf[0] = false;
        local_190._M_local_buf[0] = '\0';
        local_228._0_8_ = (element_type *)local_218;
        local_1e8._8_8_ = local_1d0;
        local_1d0._16_8_ = &local_1b0;
        local_1a0._M_allocated_capacity = (size_type)&local_190;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                    *)this_00,feature,(FeatureDescriptor *)local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_allocated_capacity != &local_190) {
          operator_delete((void *)local_1a0._M_allocated_capacity,
                          CONCAT71(local_190._M_allocated_capacity._1_7_,local_190._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._16_8_ != &local_1b0) {
          operator_delete((void *)local_1d0._16_8_,
                          CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0])
                          + 1);
        }
        if ((undefined1 *)local_1e8._8_8_ != local_1d0) {
          operator_delete((void *)local_1e8._8_8_,(ulong)(local_1d0._0_8_ + 1));
        }
        if ((undefined1 *)local_218._24_8_ != local_1f8 + 8) {
          operator_delete((void *)local_218._24_8_,local_1f8._8_8_ + 1);
        }
        if ((element_type *)local_228._0_8_ != (element_type *)local_218) {
          operator_delete((void *)local_228._0_8_,(ulong)(local_218._0_8_ + 1));
        }
        pcVar6 = this->CMakeInstance;
        pcVar4 = (cmGlobalGenerator *)(feature->_M_dataplus)._M_p;
        pcVar5 = (cmLocalGenerator *)feature->_M_string_length;
        psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
        local_228._0_8_ = (element_type *)0x9;
        local_228._8_8_ = "Feature \'";
        local_218._16_8_ = (pointer)0x1a;
        local_218._24_8_ = "\', specified by variable \'";
        local_1f8._0_8_ = featureName._M_string_length;
        local_1f8._8_8_ = featureName._M_dataplus._M_p;
        local_1e8._0_8_ = 0x76;
        local_1e8._8_8_ =
             "\', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or \"<LINK_ITEM>\" patterns are missing) and cannot be used to link target \'"
        ;
        local_1d0._0_8_ = (psVar12->_M_dataplus)._M_p;
        local_1d8 = (_Base_ptr)psVar12->_M_string_length;
        local_1d0._8_8_ = (_Base_ptr)0x2;
        local_1d0._16_8_ = (long)"\nmay not start with \'-\'." + 0x16;
        views_05._M_len = 7;
        views_05._M_array = (iterator)local_228;
        local_218._0_8_ = pcVar5;
        local_218._8_8_ = pcVar4;
        cmCatViews_abi_cxx11_((string *)local_280,views_05);
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_228);
        cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)local_280,(cmListFileBacktrace *)local_228)
        ;
joined_r0x004370bf:
        if ((cmMakefile *)local_228._8_8_ != (cmMakefile *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
        }
        local_140._M_allocated_capacity = local_280._16_8_;
        local_150._M_allocated_capacity = local_280._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_280 + 0x10)) {
LAB_00437237:
          operator_delete((void *)local_150._M_allocated_capacity,
                          (ulong)((long)&((_Base_ptr)local_140._M_allocated_capacity)->_M_color + 1)
                         );
        }
LAB_0043723f:
        bVar8 = false;
      }
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&items);
      goto LAB_0043724b;
    }
    memset((element_type *)local_218,0,0x98);
    local_228._8_8_ = (cmMakefile *)0x0;
    local_218._16_8_ = local_218._16_8_ & 0xffffffffffffff00;
    local_218._24_8_ = local_1f8 + 8;
    local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
    local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
    local_1b0._M_local_buf[0] = false;
    local_190._M_local_buf[0] = '\0';
    local_228._0_8_ = (element_type *)local_218;
    local_1e8._8_8_ = local_1d0;
    local_1d0._16_8_ = &local_1b0;
    local_1a0._M_allocated_capacity = (size_type)&local_190;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                *)this_00,feature,(FeatureDescriptor *)local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_allocated_capacity != &local_190) {
      operator_delete((void *)local_1a0._M_allocated_capacity,
                      CONCAT71(local_190._M_allocated_capacity._1_7_,local_190._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._16_8_ != &local_1b0) {
      operator_delete((void *)local_1d0._16_8_,
                      CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_1e8._8_8_ != local_1d0) {
      operator_delete((void *)local_1e8._8_8_,(ulong)(local_1d0._0_8_ + 1));
    }
    if ((undefined1 *)local_218._24_8_ != local_1f8 + 8) {
      operator_delete((void *)local_218._24_8_,local_1f8._8_8_ + 1);
    }
    if ((element_type *)local_228._0_8_ != (element_type *)local_218) {
      operator_delete((void *)local_228._0_8_,(ulong)(local_218._0_8_ + 1));
    }
    pcVar6 = this->CMakeInstance;
    pcVar4 = (cmGlobalGenerator *)(feature->_M_dataplus)._M_p;
    pcVar5 = (cmLocalGenerator *)feature->_M_string_length;
    psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    local_228._0_8_ = (element_type *)0x9;
    local_228._8_8_ = "Feature \'";
    local_218._16_8_ = (pointer)0x4c;
    local_218._24_8_ =
         "\', specified through generator-expression \'$<LINK_LIBRARY>\' to link target \'";
    local_1f8._8_8_ = (psVar12->_M_dataplus)._M_p;
    local_1f8._0_8_ = psVar12->_M_string_length;
    local_1e8._0_8_ = 0x1b;
    local_1e8._8_8_ = "\', is not defined for the \'";
    local_1d0._0_8_ = (this->LinkLanguage)._M_dataplus._M_p;
    local_1d8 = (_Base_ptr)(this->LinkLanguage)._M_string_length;
    local_1d0._8_8_ = (_Base_ptr)0x10;
    local_1d0._16_8_ = "\' link language.";
    views_04._M_len = 7;
    views_04._M_array = (iterator)local_228;
    local_218._0_8_ = pcVar5;
    local_218._8_8_ = pcVar4;
    cmCatViews_abi_cxx11_((string *)local_280,views_04);
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_228);
    cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)local_280,(cmListFileBacktrace *)local_228);
  }
  if ((cmMakefile *)local_228._8_8_ != (cmMakefile *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_280 + 0x10)) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
  }
  bVar8 = false;
LAB_0043724b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)featureName._M_dataplus._M_p != &featureName.field_2) {
    operator_delete(featureName._M_dataplus._M_p,featureName.field_2._M_allocated_capacity + 1);
  }
  return bVar8;
}

Assistant:

bool cmComputeLinkInformation::AddLibraryFeature(std::string const& feature)
{
  auto it = this->LibraryFeatureDescriptors.find(feature);
  if (it != this->LibraryFeatureDescriptors.end()) {
    return it->second.Supported;
  }

  auto featureName =
    cmStrCat("CMAKE_", this->LinkLanguage, "_LINK_LIBRARY_USING_", feature);
  cmValue featureSupported =
    this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  if (!featureSupported) {
    // language specific variable is not defined, fallback to the more generic
    // one
    featureName = cmStrCat("CMAKE_LINK_LIBRARY_USING_", feature);
    featureSupported =
      this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  }
  if (!featureSupported.IsOn()) {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});

    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(
        "Feature '", feature,
        "', specified through generator-expression '$<LINK_LIBRARY>' to "
        "link target '",
        this->Target->GetName(), "', is not supported for the '",
        this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());

    return false;
  }

  cmValue langFeature = this->Makefile->GetDefinition(featureName);
  if (!langFeature) {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});

    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(
        "Feature '", feature,
        "', specified through generator-expression '$<LINK_LIBRARY>' to "
        "link target '",
        this->Target->GetName(), "', is not defined for the '",
        this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());

    return false;
  }

  auto items =
    cmExpandListWithBacktrace(langFeature, this->Target->GetBacktrace(), true);

  if ((items.size() == 1 && !IsValidFeatureFormat(items.front().Value)) ||
      (items.size() == 3 && !IsValidFeatureFormat(items[1].Value))) {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or "
               "\"<LINK_ITEM>\" patterns "
               "are missing) and cannot be used to link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }

  // now, handle possible "PATH{}" and "NAME{}" patterns
  if (items.size() == 1) {
    items.push_back(items.front());
    FinalizeFeatureFormat(items[0].Value, "PATH{", "NAME{");
    FinalizeFeatureFormat(items[1].Value, "NAME{", "PATH{");
  } else if (items.size() == 3) {
    items.insert(items.begin() + 1, items[1]);
    FinalizeFeatureFormat(items[1].Value, "PATH{", "NAME{");
    FinalizeFeatureFormat(items[2].Value, "NAME{", "PATH{");
  } else {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (wrong number of elements) and cannot be used "
               "to link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }
  if ((items.size() == 2 && !IsValidFeatureFormat(items[0].Value)) ||
      (items.size() == 4 && !IsValidFeatureFormat(items[1].Value))) {
    // PATH{} has wrong format
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or "
               "\"<LINK_ITEM>\" patterns "
               "are missing for \"PATH{}\" alternative) and cannot be used to "
               "link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }
  if ((items.size() == 2 && !IsValidFeatureFormat(items[1].Value)) ||
      (items.size() == 4 && !IsValidFeatureFormat(items[2].Value))) {
    // NAME{} has wrong format
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or "
               "\"<LINK_ITEM>\" patterns "
               "are missing for \"NAME{}\" alternative) and cannot be used to "
               "link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }

  // replace LINKER: pattern
  this->Target->ResolveLinkerWrapper(items, this->LinkLanguage, true);

  if (items.size() == 2) {
    this->LibraryFeatureDescriptors.emplace(
      feature,
      LibraryFeatureDescriptor{ feature, items[0].Value, items[1].Value });
  } else {
    this->LibraryFeatureDescriptors.emplace(
      feature,
      LibraryFeatureDescriptor{ feature, items[0].Value, items[1].Value,
                                items[2].Value, items[3].Value });
  }

  return true;
}